

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_ec_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,int is_sk,EVP_PKEY *pk)

{
  uchar *puVar1;
  libssh2_curve_type lVar2;
  int iVar3;
  BN_CTX *ctx;
  EC_POINT *p_00;
  EC_GROUP *group_00;
  size_t __size;
  size_t sVar4;
  uchar *puVar5;
  libssh2_curve_type type;
  BN_CTX *bn_ctx;
  EC_GROUP *group;
  EC_POINT *public_key;
  size_t octal_len;
  uchar *octal_value;
  size_t key_len;
  uchar *key;
  uchar *method_buf;
  uchar *p;
  EC_KEY *ec;
  int rc;
  int is_sk_local;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  LIBSSH2_SESSION *session_local;
  
  ec._0_4_ = 0;
  p = (uchar *)0x0;
  key = (uchar *)0x0;
  octal_len = 0;
  ec._4_4_ = is_sk;
  _rc = pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = (uchar **)session;
  ctx = BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    return -1;
  }
  p = (uchar *)EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pk);
  if ((ec_key_st *)p == (ec_key_st *)0x0) {
    ec._0_4_ = -1;
  }
  else {
    p_00 = EC_KEY_get0_public_key((EC_KEY *)p);
    group_00 = EC_KEY_get0_group((EC_KEY *)p);
    lVar2 = _libssh2_ecdsa_get_curve_type((EC_KEY *)p);
    if (ec._4_4_ == 0) {
      *pubkeydata_local = (uchar *)0x13;
    }
    else {
      *pubkeydata_local = (uchar *)0x22;
    }
    key = (uchar *)(*(code *)method_local[1])(*pubkeydata_local,method_local);
    if (key == (uchar *)0x0) {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)method_local,-6,"out of memory");
      return iVar3;
    }
    if (ec._4_4_ == 0) {
      if (lVar2 == LIBSSH2_EC_CURVE_NISTP256) {
        memcpy(key,"ecdsa-sha2-nistp256",(size_t)*pubkeydata_local);
      }
      else if (lVar2 == LIBSSH2_EC_CURVE_NISTP384) {
        memcpy(key,"ecdsa-sha2-nistp384",(size_t)*pubkeydata_local);
      }
      else {
        if (lVar2 != LIBSSH2_EC_CURVE_NISTP521) {
          ec._0_4_ = -1;
          goto LAB_00118914;
        }
        memcpy(key,"ecdsa-sha2-nistp521",(size_t)*pubkeydata_local);
      }
    }
    else {
      memcpy(key,"sk-ecdsa-sha2-nistp256@openssh.com",(size_t)*pubkeydata_local);
    }
    __size = EC_POINT_point2oct(group_00,p_00,POINT_CONVERSION_UNCOMPRESSED,(uchar *)0x0,0,ctx);
    if (__size < 0x86) {
      octal_len = (size_t)malloc(__size);
      if ((uchar *)octal_len == (uchar *)0x0) {
        ec._0_4_ = -1;
      }
      else {
        sVar4 = EC_POINT_point2oct(group_00,p_00,POINT_CONVERSION_UNCOMPRESSED,(uchar *)octal_len,
                                   __size,ctx);
        if (sVar4 == __size) {
          puVar1 = *pubkeydata_local;
          puVar5 = (uchar *)(*(code *)method_local[1])(puVar1 + __size + 0x14,method_local);
          if (puVar5 == (uchar *)0x0) {
            ec._0_4_ = -1;
          }
          else {
            method_buf = puVar5;
            _libssh2_store_str(&method_buf,(char *)key,(size_t)*pubkeydata_local);
            if (ec._4_4_ == 0) {
              _libssh2_store_str(&method_buf,(char *)(key + 0xb),8);
            }
            else {
              _libssh2_store_str(&method_buf,"nistp256",8);
            }
            _libssh2_store_str(&method_buf,(char *)octal_len,__size);
            *method_len_local = (size_t)key;
            *pubkeydata_len_local = (size_t)puVar5;
            *_rc = (size_t)(puVar1 + __size + 0x14);
          }
        }
        else {
          ec._0_4_ = -1;
        }
      }
    }
    else {
      ec._0_4_ = -1;
    }
  }
LAB_00118914:
  if (p != (uchar *)0x0) {
    EC_KEY_free((EC_KEY *)p);
  }
  if (ctx != (BN_CTX *)0x0) {
    BN_CTX_free(ctx);
  }
  if (octal_len != 0) {
    free((void *)octal_len);
  }
  if ((int)ec == 0) {
    session_local._4_4_ = 0;
  }
  else {
    if (key != (uchar *)0x0) {
      (*(code *)method_local[3])(key,method_local);
    }
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
gen_publickey_from_ec_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          int is_sk,
                          EVP_PKEY *pk)
{
    int rc = 0;
    EC_KEY *ec = NULL;
    unsigned char *p;
    unsigned char *method_buf = NULL;
    unsigned char *key;
    size_t  key_len = 0;
    unsigned char *octal_value = NULL;
    size_t octal_len;
    const EC_POINT *public_key;
    const EC_GROUP *group;
    BN_CTX *bn_ctx;
    libssh2_curve_type type;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from EC private key envelope"));

    bn_ctx = BN_CTX_new();
    if(!bn_ctx)
        return -1;

    ec = EVP_PKEY_get1_EC_KEY(pk);
    if(!ec) {
        rc = -1;
        goto clean_exit;
    }

    public_key = EC_KEY_get0_public_key(ec);
    group = EC_KEY_get0_group(ec);
    type = _libssh2_ecdsa_get_curve_type(ec);

    if(is_sk)
        *method_len = 34;
    else
        *method_len = 19;

    method_buf = LIBSSH2_ALLOC(session, *method_len);
    if(!method_buf) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "out of memory");
    }

    if(is_sk)
        memcpy(method_buf, "sk-ecdsa-sha2-nistp256@openssh.com", *method_len);
    else if(type == LIBSSH2_EC_CURVE_NISTP256)
        memcpy(method_buf, "ecdsa-sha2-nistp256", *method_len);
    else if(type == LIBSSH2_EC_CURVE_NISTP384)
        memcpy(method_buf, "ecdsa-sha2-nistp384", *method_len);
    else if(type == LIBSSH2_EC_CURVE_NISTP521)
        memcpy(method_buf, "ecdsa-sha2-nistp521", *method_len);
    else {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_ERROR,
                       "Unsupported EC private key type"));
        rc = -1;
        goto clean_exit;
    }

    /* get length */
    octal_len = EC_POINT_point2oct(group, public_key,
                                   POINT_CONVERSION_UNCOMPRESSED,
                                   NULL, 0, bn_ctx);
    if(octal_len > EC_MAX_POINT_LEN) {
        rc = -1;
        goto clean_exit;
    }

    octal_value = malloc(octal_len);
    if(!octal_value) {
        rc = -1;
        goto clean_exit;
    }

    /* convert to octal */
    if(EC_POINT_point2oct(group, public_key, POINT_CONVERSION_UNCOMPRESSED,
       octal_value, octal_len, bn_ctx) != octal_len) {
        rc = -1;
        goto clean_exit;
    }

    /* Key form is: type_len(4) + type(method_len) + domain_len(4) + domain(8)
       + pub_key_len(4) + pub_key(~65). */
    key_len = 4 + *method_len + 4 + 8 + 4 + octal_len;
    key = LIBSSH2_ALLOC(session, key_len);
    if(!key) {
        rc = -1;
        goto clean_exit;
    }

    /* Process key encoding. */
    p = key;

    /* Key type */
    _libssh2_store_str(&p, (const char *)method_buf, *method_len);

    /* Name domain */
    if(is_sk) {
        _libssh2_store_str(&p, "nistp256", 8);
    }
    else {
        _libssh2_store_str(&p, (const char *)method_buf + 11, 8);
    }

    /* Public key */
    _libssh2_store_str(&p, (const char *)octal_value, octal_len);

    *method         = method_buf;
    *pubkeydata     = key;
    *pubkeydata_len = key_len;

clean_exit:

    if(ec)
        EC_KEY_free(ec);

    if(bn_ctx) {
        BN_CTX_free(bn_ctx);
    }

    if(octal_value)
        free(octal_value);

    if(rc == 0)
        return 0;

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    return -1;
}